

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int verify_cert_chain(X509_STORE *store,X509 *cert,stack_st_X509 *chain,int is_server,
                     char *server_name)

{
  int iVar1;
  int iVar2;
  X509_STORE_CTX *ctx;
  size_t sVar3;
  int iVar4;
  
  if (server_name == (char *)0x0) {
    __assert_fail("server_name != NULL && \"ptls_set_server_name MUST be called\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/openssl.c"
                  ,0x4cd,
                  "int verify_cert_chain(X509_STORE *, X509 *, struct stack_st_X509 *, int, const char *)"
                 );
  }
  ctx = X509_STORE_CTX_new();
  if (ctx == (X509_STORE_CTX *)0x0) {
    return 0x201;
  }
  iVar1 = X509_STORE_CTX_init(ctx,(X509_STORE *)store,(X509 *)cert,(stack_st_X509 *)chain);
  iVar2 = 0x203;
  if (iVar1 != 1) goto LAB_00127aec;
  X509_STORE_CTX_set_purpose(ctx,2 - (uint)(is_server == 0));
  iVar2 = X509_verify_cert(ctx);
  if (iVar2 == 1) {
    iVar2 = ptls_server_name_is_ipaddr(server_name);
    if (iVar2 == 0) {
      sVar3 = strlen(server_name);
      iVar1 = X509_check_host(cert,server_name,sVar3,4,0);
    }
    else {
      iVar1 = X509_check_ip_asc(cert,server_name,0);
    }
    iVar4 = 0x203;
    if (iVar1 == 0) {
      iVar4 = 0x2a;
    }
    iVar2 = 0;
    if (iVar1 != 1) {
      iVar2 = iVar4;
    }
    goto LAB_00127aec;
  }
  iVar2 = X509_STORE_CTX_get_error(ctx);
  if (0x10 < iVar2) {
    switch(iVar2) {
    case 0x11:
      iVar2 = 0x201;
      break;
    case 0x14:
    case 0x1b:
    case 0x1c:
switchD_00127a79_caseD_14:
      iVar2 = 0x30;
      break;
    case 0x17:
      iVar2 = 0x2c;
      break;
    default:
      if (iVar2 == 0x4f) {
        iVar2 = 0x2a;
        break;
      }
    case 0x12:
    case 0x13:
    case 0x15:
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
switchD_00127a79_caseD_12:
      iVar2 = 0x2e;
    }
LAB_00127aec:
    X509_STORE_CTX_free(ctx);
    return iVar2;
  }
  if (iVar2 - 9U < 2) {
    iVar2 = 0x2d;
    goto LAB_00127aec;
  }
  if (iVar2 == 2) goto switchD_00127a79_caseD_14;
  goto switchD_00127a79_caseD_12;
}

Assistant:

static int verify_cert_chain(X509_STORE *store, X509 *cert, STACK_OF(X509) * chain, int is_server, const char *server_name)
{
    X509_STORE_CTX *verify_ctx;
    int ret;

    assert(server_name != NULL && "ptls_set_server_name MUST be called");

    /* verify certificate chain */
    if ((verify_ctx = X509_STORE_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (X509_STORE_CTX_init(verify_ctx, store, cert, chain) != 1) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    X509_STORE_CTX_set_purpose(verify_ctx, is_server ? X509_PURPOSE_SSL_SERVER : X509_PURPOSE_SSL_CLIENT);
    if (X509_verify_cert(verify_ctx) != 1) {
        int x509_err = X509_STORE_CTX_get_error(verify_ctx);
        switch (x509_err) {
        case X509_V_ERR_OUT_OF_MEM:
            ret = PTLS_ERROR_NO_MEMORY;
            break;
        case X509_V_ERR_CERT_REVOKED:
            ret = PTLS_ALERT_CERTIFICATE_REVOKED;
            break;
        case X509_V_ERR_CERT_NOT_YET_VALID:
        case X509_V_ERR_CERT_HAS_EXPIRED:
            ret = PTLS_ALERT_CERTIFICATE_EXPIRED;
            break;
        case X509_V_ERR_UNABLE_TO_GET_ISSUER_CERT:
        case X509_V_ERR_UNABLE_TO_GET_ISSUER_CERT_LOCALLY:
        case X509_V_ERR_CERT_UNTRUSTED:
        case X509_V_ERR_CERT_REJECTED:
            ret = PTLS_ALERT_UNKNOWN_CA;
            break;
        case X509_V_ERR_INVALID_CA:
            ret = PTLS_ALERT_BAD_CERTIFICATE;
            break;
        default:
            ret = PTLS_ALERT_CERTIFICATE_UNKNOWN;
            break;
        }
        goto Exit;
    }

#ifdef X509_CHECK_FLAG_NO_PARTIAL_WILDCARDS
    /* verify CN */
    if (server_name != NULL) {
        if (ptls_server_name_is_ipaddr(server_name)) {
            ret = X509_check_ip_asc(cert, server_name, 0);
        } else {
            ret = X509_check_host(cert, server_name, strlen(server_name), X509_CHECK_FLAG_NO_PARTIAL_WILDCARDS, NULL);
        }
        if (ret != 1) {
            if (ret == 0) { /* failed match */
                ret = PTLS_ALERT_BAD_CERTIFICATE;
            } else {
                ret = PTLS_ERROR_LIBRARY;
            }
            goto Exit;
        }
    }
#else
#warning "hostname validation is disabled; OpenSSL >= 1.0.2 or LibreSSL >= 2.5.0 is required"
#endif

    ret = 0;

Exit:
    if (verify_ctx != NULL)
        X509_STORE_CTX_free(verify_ctx);
    return ret;
}